

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O2

bool getdamagebindictionary
               (vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec_)

{
  pointer pdVar1;
  FILE *__stream;
  ulong uVar2;
  void *__ptr;
  size_t sVar3;
  ulong __n;
  char *__format;
  long lVar4;
  
  __stream = fopen("static/damage_bin_dict.bin","rb");
  if (__stream == (FILE *)0x0) {
    __format = "FATAL: %s: cannot open %s\n";
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    __n = uVar2 / 0x14 & 0xffffffff;
    __ptr = operator_new__(__n * 0x14);
    sVar3 = fread(__ptr,0x14,__n,__stream);
    if (sVar3 == __n) {
      pdVar1 = (damagebindictionary_vec_->
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((damagebindictionary_vec_->
          super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar1) {
        (damagebindictionary_vec_->
        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl.
        super__Vector_impl_data._M_finish = pdVar1;
      }
      for (lVar4 = 0; (uVar2 / 0x14 & 0xffffffff) * 0x14 - lVar4 != 0; lVar4 = lVar4 + 0x14) {
        std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::push_back
                  (damagebindictionary_vec_,(value_type *)((long)__ptr + lVar4));
      }
      operator_delete__(__ptr);
      fclose(__stream);
      return true;
    }
    __format = "FATAL: %s: Error reading file %s\n";
  }
  fprintf(_stderr,__format,"getdamagebindictionary","static/damage_bin_dict.bin");
  exit(-1);
}

Assistant:

bool getdamagebindictionary(std::vector<damagebindictionary> &damagebindictionary_vec_)
{

	FILE *fin = fopen(DAMAGE_BIN_DICT_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, DAMAGE_BIN_DICT_FILE);
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);

	flseek(fin, 0L, SEEK_SET);
	unsigned int nrec = static_cast<unsigned int>(sz / sizeof(damagebindictionary));
	damagebindictionary *s1 = new damagebindictionary[nrec];
	if (fread(s1, sizeof(damagebindictionary), nrec, fin) != nrec) {
		fprintf(stderr, "FATAL: %s: Error reading file %s\n", __func__, DAMAGE_BIN_DICT_FILE);
		exit(-1);
	}
	damagebindictionary_vec_.clear();

	for (unsigned int i = 0; i < nrec; i++) {
		damagebindictionary_vec_.push_back(s1[i]);
	}
	delete[] s1;

	fclose(fin);
	return true;
}